

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

int mcpl_tool(int argc,char **argv)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  long *__ptr;
  FILE *__stream;
  mcpl_file_t mVar7;
  mcpl_particle_t *pmVar8;
  mcpl_outfile_t mVar9;
  int iVar10;
  uint64_t *puVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  mcpl_fileinternal_t *f;
  ulong uVar17;
  long lVar18;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  int64_t opt_num_skip;
  int64_t opt_num_limit;
  uint32_t ldata;
  char comment [1024];
  ulong local_4b8;
  int local_4ac;
  int local_494;
  char *local_490;
  int local_488;
  char *local_480;
  uint64_t local_478;
  uint64_t local_470;
  int local_464;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  int local_448;
  int local_444;
  int local_440;
  uint local_43c;
  undefined8 local_438;
  uint64_t uVar19;
  
  local_470 = 0xffffffffffffffff;
  local_478 = 0xffffffffffffffff;
  if (argc < 2) {
    bVar22 = false;
    bVar20 = true;
    local_450 = 0;
    local_458 = 0;
    bVar23 = true;
    bVar2 = false;
    bVar21 = false;
    local_494 = 0;
    bVar4 = false;
    bVar3 = false;
    local_460 = 0;
    local_488 = 0;
    local_480 = (char *)0x0;
    local_490 = (char *)0x0;
    __ptr = (long *)0x0;
    uVar16 = 0;
  }
  else {
    uVar12 = 1;
    uVar16 = 0;
    __ptr = (long *)0x0;
    local_490 = (char *)0x0;
    local_480 = (char *)0x0;
    local_488 = 0;
    local_460 = 0;
    bVar3 = false;
    bVar4 = false;
    local_494 = 0;
    local_440 = 0;
    bVar2 = false;
    local_444 = 0;
    local_458 = 0;
    local_450 = 0;
    local_464 = 0;
    local_448 = 0;
    do {
      pcVar14 = argv[uVar12];
      sVar6 = strlen(pcVar14);
      if (sVar6 == 0) {
        bVar20 = false;
      }
      else if (((sVar6 == 1) || (*pcVar14 != '-')) || (pcVar14[1] == '-')) {
        if (((sVar6 < 3) || (*pcVar14 != '-')) || (pcVar14[1] != '-')) {
          if (*pcVar14 != '-') {
            if (__ptr == (long *)0x0) {
              __ptr = (long *)mcpl_internal_calloc((ulong)(uint)argc,8);
            }
            __ptr[(int)uVar16] = (long)pcVar14;
            uVar16 = uVar16 + 1;
            goto LAB_001054d3;
          }
          free(__ptr);
          printf("ERROR: %s\n\n","Bad arguments");
          puts("Run with -h or --help for usage information");
          bVar20 = true;
          local_4ac = 1;
        }
        else {
          pcVar14 = pcVar14 + 2;
          sVar6 = strlen(pcVar14);
          iVar5 = strncmp("help",pcVar14,sVar6);
          if (iVar5 == 0) {
            free(__ptr);
            bVar23 = false;
            local_4ac = mcpl_tool_usage(argv,(char *)0x0);
          }
          else {
            iVar5 = strncmp("justhead",pcVar14,sVar6);
            if (iVar5 == 0) {
              local_488 = 1;
            }
            else {
              iVar5 = strncmp("nohead",pcVar14,sVar6);
              if (iVar5 == 0) {
                local_460 = 1;
              }
              else {
                iVar5 = strncmp("merge",pcVar14,sVar6);
                if (iVar5 == 0) {
                  bVar3 = true;
                }
                else {
                  iVar5 = strncmp("forcemerge",pcVar14,sVar6);
                  if (iVar5 == 0) {
                    bVar4 = true;
                  }
                  else {
                    iVar5 = strncmp("keepuserflags",pcVar14,sVar6);
                    if (iVar5 == 0) {
                      local_494 = 1;
                    }
                    else {
                      iVar5 = strncmp("inplace",pcVar14,sVar6);
                      if (iVar5 == 0) {
                        local_440 = 1;
                      }
                      else {
                        iVar5 = strncmp("extract",pcVar14,sVar6);
                        if (iVar5 == 0) {
                          bVar2 = true;
                        }
                        else {
                          iVar5 = strncmp("repair",pcVar14,sVar6);
                          if (iVar5 == 0) {
                            local_458 = 1;
                          }
                          else {
                            iVar5 = strncmp("version",pcVar14,sVar6);
                            if (iVar5 == 0) {
                              local_450 = 1;
                            }
                            else {
                              iVar5 = strncmp("preventcomment",pcVar14,sVar6);
                              if (iVar5 == 0) {
                                local_444 = 1;
                              }
                              else {
                                iVar5 = strncmp("fakeversion",pcVar14,sVar6);
                                if (iVar5 == 0) {
                                  local_448 = 1;
                                }
                                else {
                                  iVar5 = strncmp("text",pcVar14,sVar6);
                                  if (iVar5 != 0) {
                                    free(__ptr);
                                    bVar23 = false;
                                    printf("ERROR: %s\n\n","Unrecognised option");
                                    puts("Run with -h or --help for usage information");
                                    local_4ac = 1;
                                    goto LAB_00105862;
                                  }
                                  local_464 = 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            bVar23 = true;
          }
LAB_00105862:
          bVar20 = true;
          if (bVar23) {
LAB_001054d3:
            bVar20 = false;
          }
        }
      }
      else {
        bVar23 = true;
        if (1 < sVar6) {
          pcVar14 = pcVar14 + 2;
          lVar15 = sVar6 - 2;
          puVar11 = (uint64_t *)0x0;
          do {
            if (puVar11 != (uint64_t *)0x0) {
              if ((byte)(pcVar14[-1] - 0x3aU) < 0xf6) {
                free(__ptr);
                pcVar14 = "Bad option: expected number";
                goto LAB_0010566c;
              }
              uVar19 = *puVar11;
              *puVar11 = uVar19 * 10;
              *puVar11 = (uVar19 * 10 + (long)pcVar14[-1]) - 0x30;
              goto LAB_001055d6;
            }
            switch(pcVar14[-1]) {
            case 'b':
              if (local_490 != (char *)0x0) {
                free(__ptr);
                pcVar14 = "-b specified more than once";
                goto LAB_0010566c;
              }
              local_490 = pcVar14;
              if (lVar15 == 0) {
                free(__ptr);
                bVar23 = false;
                printf("ERROR: %s\n\n","Missing argument for -b");
                puts("Run with -h or --help for usage information");
                local_4ac = 1;
                local_490 = (char *)0x0;
              }
              goto LAB_00105687;
            default:
              free(__ptr);
              pcVar14 = "Unrecognised option";
              goto LAB_0010566c;
            case 'e':
              bVar2 = true;
              break;
            case 'h':
              free(__ptr);
              bVar23 = false;
              local_4ac = mcpl_tool_usage(argv,(char *)0x0);
              goto LAB_00105687;
            case 'j':
              local_488 = 1;
              break;
            case 'l':
              puVar11 = &local_470;
              goto LAB_001055c1;
            case 'm':
              bVar3 = true;
              break;
            case 'n':
              local_460 = 1;
              break;
            case 'p':
              if (local_480 != (char *)0x0) {
                free(__ptr);
                pcVar14 = "-p specified more than once";
                goto LAB_0010566c;
              }
              local_480 = pcVar14;
              if (lVar15 == 0) {
                free(__ptr);
                bVar23 = false;
                printf("ERROR: %s\n\n","Missing argument for -p");
                puts("Run with -h or --help for usage information");
                local_4ac = 1;
                local_480 = (char *)0x0;
              }
              goto LAB_00105687;
            case 'r':
              local_458 = 1;
              break;
            case 's':
              puVar11 = &local_478;
              goto LAB_001055c1;
            case 't':
              local_464 = 1;
              break;
            case 'v':
              local_450 = 1;
            }
            puVar11 = (uint64_t *)0x0;
LAB_001055c1:
            if (puVar11 == (uint64_t *)0x0) {
              puVar11 = (uint64_t *)0x0;
            }
            else {
              *puVar11 = 0;
              if (lVar15 == 0) {
                free(__ptr);
                pcVar14 = "Bad option: missing number";
LAB_0010566c:
                bVar23 = false;
                printf("ERROR: %s\n\n",pcVar14);
                puts("Run with -h or --help for usage information");
                local_4ac = 1;
                break;
              }
            }
LAB_001055d6:
            pcVar14 = pcVar14 + 1;
            bVar20 = lVar15 != 0;
            lVar15 = lVar15 + -1;
          } while (bVar20);
        }
LAB_00105687:
        bVar20 = true;
        if (bVar23) goto LAB_001054d3;
      }
      if (bVar20) {
        return local_4ac;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)argc);
    bVar20 = local_448 == 0;
    bVar21 = local_440 != 0;
    bVar22 = local_464 != 0;
    bVar23 = local_444 == 0;
  }
  if (!bVar20) {
    mcpl_internal_fakeconstantversion_fakev = '\x01';
  }
  if ((!bVar2) && (local_480 != (char *)0x0)) {
    free(__ptr);
    pcVar14 = "-p can only be used with --extract.";
    goto LAB_00105abc;
  }
  if ((!bVar3 & bVar21) == 1) {
    free(__ptr);
    pcVar14 = "--inplace can only be used with --merge.";
    goto LAB_00105abc;
  }
  if (local_494 != 0 && !bVar4) {
    free(__ptr);
    pcVar14 = "--keepuserflags can only be used with --forcemerge.";
    goto LAB_00105abc;
  }
  if (bVar4 && bVar3) {
    free(__ptr);
    pcVar14 = "--merge and --forcemerge can not both be specified .";
    goto LAB_00105abc;
  }
  iVar5 = (int)local_460;
  iVar10 = (iVar5 + local_488 + 1) - (uint)(local_490 == (char *)0x0);
  if (!bVar2) {
    iVar10 = iVar10 + (uint)(local_470 != 0xffffffffffffffff) +
             (uint)(local_478 != 0xffffffffffffffff);
  }
  bVar20 = bVar2 || local_480 != (char *)0x0;
  pcVar14 = (char *)(ulong)bVar20;
  if (1 < (int)(((uint)bVar22 + (int)local_458 + (int)local_450 + (uint)(bVar3 || bVar4) +
                 (uint)bVar20 + 1) - (uint)(iVar10 == 0))) {
    free(__ptr);
    pcVar14 = "Conflicting options specified.";
    goto LAB_00105abc;
  }
  if ((local_490 != (char *)0x0) && (1 < iVar10)) {
    free(__ptr);
    pcVar14 = "Do not specify other dump options with -b.";
    goto LAB_00105abc;
  }
  if ((int)local_450 != 0) {
    free(__ptr);
    if (uVar16 == 0) {
      if (mcpl_internal_fakeconstantversion_fakev == '\x01') {
        pcVar14 = "MCPL version 99.99.99";
      }
      else {
        pcVar14 = "MCPL version 2.0.0";
      }
      puts(pcVar14);
      return 0;
    }
    pcVar14 = "Unrecognised arguments for --version.";
    goto LAB_00105abc;
  }
  if (!bVar3 && !bVar4) {
    if (bVar2) {
      if ((int)uVar16 < 3) {
        if (uVar16 != 2) {
          free(__ptr);
          pcVar14 = "Must specify both input and output files with --extract.";
          goto LAB_00105abc;
        }
        iVar5 = mcpl_file_certainly_exists((char *)__ptr[1]);
        if (iVar5 == 0) {
          local_438._0_4_ = 0;
          mVar7 = mcpl_actual_open_file((char *)*__ptr,(int *)&local_438);
          mVar9 = mcpl_create_outfile((char *)__ptr[1]);
          mcpl_transfer_metadata(mVar7,mVar9);
          uVar1 = *(undefined8 *)((long)mVar7.internal + 0x40);
          if (bVar23) {
            snprintf((char *)&local_438,0x400,
                     "mcpltool: extracted particles from file with %lu particles");
            mcpl_hdr_add_comment(mVar9,(char *)&local_438);
          }
          iVar5 = 0;
          if (local_480 != (char *)0x0) {
            iVar5 = mcpl_str2int(local_480,0,&local_438);
            if ((iVar5 == 0) ||
               (CONCAT44(local_438._4_4_,(int)local_438) == 0 ||
                (long)(int)local_438 != CONCAT44(local_438._4_4_,(int)local_438))) {
              free(__ptr);
              printf("ERROR: %s\n\n","Must specify non-zero 32bit integer as argument to -p.");
              puts("Run with -h or --help for usage information");
              local_4ac = 1;
              bVar20 = false;
              iVar5 = 0;
            }
            else {
              bVar20 = true;
              iVar5 = (int)local_438;
            }
            if (!bVar20) {
              return local_4ac;
            }
          }
          if (0 < (long)local_478) {
            mcpl_seek(mVar7,local_478);
          }
          uVar19 = 0xffffffffffffffff;
          if (0 < (long)local_470) {
            uVar19 = local_470;
          }
          lVar18 = uVar19 + 1;
          lVar15 = 0;
          do {
            lVar18 = lVar18 + -1;
            if (lVar18 == 0) break;
            pmVar8 = mcpl_read(mVar7);
            if ((pmVar8 != (mcpl_particle_t *)0x0) && ((iVar5 == 0 || (iVar5 == pmVar8->pdgcode))))
            {
              mcpl_transfer_last_read_particle(mVar7,mVar9);
              lVar15 = lVar15 + 1;
            }
          } while (pmVar8 != (mcpl_particle_t *)0x0);
          pcVar14 = *mVar9.internal;
          sVar6 = strlen(pcVar14);
          pcVar13 = mcpl_internal_malloc(sVar6 + 4);
          memcpy(pcVar13,pcVar14,sVar6 + 1);
          iVar5 = mcpl_closeandgzip_outfile(mVar9);
          if (iVar5 != 0) {
            builtin_strncpy(pcVar13 + sVar6,".gz",4);
          }
          mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar7.internal);
          printf("MCPL: Successfully extracted %lu / %lu particles from %s into %s\n",lVar15,uVar1,
                 *__ptr,pcVar13);
          free(pcVar13);
          free(__ptr);
          return 0;
        }
LAB_00105d8b:
        free(__ptr);
        pcVar14 = "Requested output file already exists.";
        goto LAB_00105abc;
      }
    }
    else if (bVar22 == false) {
      if ((int)uVar16 < 2) {
        if (uVar16 == 0) {
          free(__ptr);
          pcVar14 = "No input file specified";
          goto LAB_00105abc;
        }
        if ((int)local_458 == 0) {
          if (local_490 != (char *)0x0) {
            local_438._0_4_ = 0;
            mVar7 = mcpl_actual_open_file((char *)*__ptr,(int *)&local_438);
            iVar5 = mcpl_hdr_blob(mVar7,local_490,&local_43c,(char **)&local_438);
            if (iVar5 != 0) {
              mcpl_internal_dump_to_stdout
                        ((char *)CONCAT44(local_438._4_4_,(int)local_438),(ulong)local_43c);
              free(__ptr);
            }
            mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar7.internal);
            return (uint)(iVar5 == 0);
          }
          if ((local_488 == 0) ||
             ((local_470 == 0xffffffffffffffff && (local_478 == 0xffffffffffffffff)))) {
            if ((long)local_470 < 0) {
              local_470 = 10;
            }
            if ((long)local_478 < 0) {
              local_478 = 0;
            }
            if ((local_488 == 0) || (iVar5 == 0)) {
              uVar16 = 2;
              if (iVar5 == 0) {
                uVar16 = (uint)(local_488 != 0);
              }
              mcpl_dump((char *)*__ptr,uVar16,local_478,local_470);
              goto LAB_00105bff;
            }
            free(__ptr);
            pcVar14 = "Do not supply both --justhead and --nohead.";
          }
          else {
            free(__ptr);
            pcVar14 = "Do not specify -l or -s with --justhead";
          }
          goto LAB_00105abc;
        }
        mcpl_repair((char *)*__ptr);
        goto LAB_00105bff;
      }
    }
    else if ((int)uVar16 < 3) {
      if (uVar16 != 2) {
        free(__ptr);
        pcVar14 = "Must specify both input and output files with --text.";
        goto LAB_00105abc;
      }
      iVar5 = mcpl_file_certainly_exists((char *)__ptr[1]);
      if (iVar5 == 0) {
        local_438._0_4_ = 0;
        mVar7 = mcpl_actual_open_file((char *)*__ptr,(int *)&local_438);
        __stream = (FILE *)mcpl_internal_fopen((char *)__ptr[1],"w");
        if (__stream != (FILE *)0x0) {
          fprintf(__stream,"#MCPL-ASCII\n#ASCII-FORMAT: v1\n#NPARTICLES: %lu\n#END-HEADER\n",
                  *(undefined8 *)((long)mVar7.internal + 0x40));
          fwrite("index     pdgcode               ekin[MeV]                   x[cm]                   y[cm]                   z[cm]                      ux                      uy                      uz                time[ms]                  weight                   pol-x                   pol-y                   pol-z  userflags\n"
                 ,0x13d,1,__stream);
          pmVar8 = mcpl_read(mVar7);
          while (pmVar8 != (mcpl_particle_t *)0x0) {
            fprintf(__stream,
                    "%5lu %11i %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g 0x%08x\n"
                    ,pmVar8->ekin,pmVar8->position[0],pmVar8->position[1],pmVar8->position[2],
                    pmVar8->direction[0],pmVar8->direction[1],pmVar8->direction[2],pmVar8->time,
                    *(long *)((long)mVar7.internal + 0x88) + -1,(ulong)(uint)pmVar8->pdgcode,
                    (ulong)pmVar8->userflags);
            pmVar8 = mcpl_read(mVar7);
          }
          fclose(__stream);
          mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar7.internal);
          goto LAB_00105bff;
        }
        mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar7.internal);
        free(__ptr);
        pcVar14 = "Could not open output file.";
        goto LAB_00105abc;
      }
      goto LAB_00105d8b;
    }
    free(__ptr);
    pcVar14 = "Too many arguments.";
LAB_00105abc:
    printf("ERROR: %s\n\n",pcVar14);
    puts("Run with -h or --help for usage information");
    return 1;
  }
  if ((int)uVar16 < 2) {
    free(__ptr);
    pcVar14 = "Too few arguments for --merge.";
    if (bVar4) {
      pcVar14 = "Too few arguments for --forcemerge.";
    }
    goto LAB_00105abc;
  }
  local_4b8 = (ulong)bVar21 ^ 1;
  if ((!bVar4) && ((int)(2 - bVar21) < (int)uVar16)) {
    uVar12 = (ulong)(2 - bVar21);
    do {
      pcVar14 = (char *)__ptr[uVar12];
      iVar5 = mcpl_can_merge((char *)__ptr[local_4b8],pcVar14);
      if (iVar5 == 0) {
        free(__ptr);
        pcVar14 = "Requested files are incompatible for merge as they have different header info.";
        goto LAB_00105abc;
      }
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
  }
  if (bVar21 != false) {
    if ((bVar4) || (!bVar3)) {
      pcVar13 = "logic error in argument parsing";
      mcpl_error("logic error in argument parsing");
      pcVar13 = (char *)write(1,pcVar13,(size_t)pcVar14);
      if (pcVar13 == pcVar14) {
        return (int)pcVar13;
      }
      (*mcpl_error_handler)("Problems writing to stdout");
      printf("MCPL ERROR: %s\n",
             "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!"
            );
      exit(1);
    }
    uVar12 = 2;
    if (2 < (int)uVar16) {
      uVar12 = (ulong)uVar16;
    }
    uVar17 = 1;
    do {
      mcpl_merge_inplace((char *)__ptr[local_4b8],(char *)__ptr[uVar17]);
      uVar17 = uVar17 + 1;
    } while (uVar12 != uVar17);
    goto LAB_00105bff;
  }
  iVar5 = mcpl_file_certainly_exists((char *)*__ptr);
  if (iVar5 != 0) goto LAB_00105d8b;
  pcVar14 = (char *)*__ptr;
  sVar6 = strlen(pcVar14);
  if ((sVar6 < 9) || (iVar5 = strcmp(pcVar14 + (sVar6 - 8),".mcpl.gz"), iVar5 != 0)) {
    bVar20 = true;
    if ((sVar6 < 4) || (iVar5 = strcmp(pcVar14 + (sVar6 - 3),".gz"), iVar5 != 0)) goto LAB_00106219;
    free(__ptr);
    pcVar14 = "Requested output file should not have .gz extension (unless it is .mcpl.gz).";
LAB_0010615f:
    bVar20 = false;
    printf("ERROR: %s\n\n",pcVar14);
    puts("Run with -h or --help for usage information");
    local_4ac = 1;
  }
  else {
    pcVar14 = mcpl_internal_malloc(sVar6 - 2);
    memcpy(pcVar14,(void *)*__ptr,sVar6 - 3);
    pcVar14[sVar6 - 3] = '\0';
    iVar5 = mcpl_file_certainly_exists(pcVar14);
    if (iVar5 != 0) {
      free(__ptr);
      pcVar14 = "Requested output file already exists (without .gz extension).";
      goto LAB_0010615f;
    }
    bVar20 = false;
LAB_00106219:
    if (bVar4) {
      mVar9 = mcpl_forcemerge_files(pcVar14,uVar16 - 1,(char **)(__ptr + 1),local_494);
    }
    else {
      mVar9 = mcpl_merge_files(pcVar14,uVar16 - 1,(char **)(__ptr + 1));
    }
    if (bVar20) {
      mcpl_close_outfile(mVar9);
    }
    else {
      iVar5 = mcpl_closeandgzip_outfile(mVar9);
      if (iVar5 == 0) {
        printf("MCPL WARNING: Failed to gzip output. Non-gzipped output is found in %s\n",pcVar14);
      }
    }
    bVar20 = true;
    if (pcVar14 != (char *)*__ptr) {
      free(pcVar14);
    }
  }
  if (!bVar20) {
    return local_4ac;
  }
LAB_00105bff:
  free(__ptr);
  return 0;
}

Assistant:

int mcpl_tool(int argc,char** argv) {

  int nfilenames = 0;
  char ** filenames = NULL;
  const char * blobkey = NULL;
  const char * pdgcode_str = NULL;
  int opt_justhead = 0;
  int opt_nohead = 0;
  int64_t opt_num_limit = -1;
  int64_t opt_num_skip = -1;
  int opt_merge = 0;
  int opt_forcemerge = 0;
  int opt_keepuserflags = 0;
  int opt_inplace = 0;
  int opt_extract = 0;
  int opt_preventcomment = 0;//undocumented unoffical flag for mcpl unit tests
  int opt_repair = 0;
  int opt_version = 0;
  int opt_text = 0;
  int opt_fakeversion = 0;//undocumented unoffical flag for mcpl unit tests

  int i;
  for (i = 1; i<argc; ++i) {
    char * a = argv[i];
    size_t n=strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = NULL;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9') {
            free(filenames);
            return mcpl_tool_usage(argv,"Bad option: expected number");
          }
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        if (a[j]=='b') {
          if (blobkey) {
            free(filenames);
            return mcpl_tool_usage(argv,"-b specified more than once");
          }
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Missing argument for -b");
          }
          blobkey = a+j+1;
          break;
        }
        if (a[j]=='p') {
          if (pdgcode_str) {
            free(filenames);
            return mcpl_tool_usage(argv,"-p specified more than once");
          }
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Missing argument for -p");
          }
          pdgcode_str = a+j+1;
          break;
        }

        switch(a[j]) {
        case 'h':
          {
            free(filenames);
            return mcpl_tool_usage(argv,0);
          }
        case 'j': opt_justhead = 1; break;
        case 'n': opt_nohead = 1; break;
        case 'm': opt_merge = 1; break;
        case 'e': opt_extract = 1; break;
        case 'r': opt_repair = 1; break;
        case 'v': opt_version = 1; break;
        case 't': opt_text = 1; break;
        case 'l': consume_digit = &opt_num_limit; break;
        case 's': consume_digit = &opt_num_skip; break;
        default:
          {
            free(filenames);
            return mcpl_tool_usage(argv,"Unrecognised option");
          }
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Bad option: missing number");
          }
        }
      }
    } else if (n>=3&&a[0]=='-'&&a[1]=='-') {
      a+=2;
      //long options:
      const char * lo_help = "help";
      const char * lo_justhead = "justhead";
      const char * lo_nohead = "nohead";
      const char * lo_merge = "merge";
      const char * lo_inplace = "inplace";
      const char * lo_extract = "extract";
      const char * lo_preventcomment = "preventcomment";
      const char * lo_fakeversion = "fakeversion";
      const char * lo_repair = "repair";
      const char * lo_version = "version";
      const char * lo_text = "text";
      const char * lo_forcemerge = "forcemerge";
      const char * lo_keepuserflags = "keepuserflags";
      //Use strstr instead of "strcmp(a,"--help")==0" to support shortened
      //versions (works since all our long-opts start with unique char).
      if (strstr(lo_help,a)==lo_help) return free(filenames), mcpl_tool_usage(argv,0);
      else if (strstr(lo_justhead,a)==lo_justhead) opt_justhead = 1;
      else if (strstr(lo_nohead,a)==lo_nohead) opt_nohead = 1;
      else if (strstr(lo_merge,a)==lo_merge) opt_merge = 1;
      else if (strstr(lo_forcemerge,a)==lo_forcemerge) opt_forcemerge = 1;
      else if (strstr(lo_keepuserflags,a)==lo_keepuserflags) opt_keepuserflags = 1;
      else if (strstr(lo_inplace,a)==lo_inplace) opt_inplace = 1;
      else if (strstr(lo_extract,a)==lo_extract) opt_extract = 1;
      else if (strstr(lo_repair,a)==lo_repair) opt_repair = 1;
      else if (strstr(lo_version,a)==lo_version) opt_version = 1;
      else if (strstr(lo_preventcomment,a)==lo_preventcomment) opt_preventcomment = 1;
      else if (strstr(lo_fakeversion,a)==lo_fakeversion) opt_fakeversion = 1;
      else if (strstr(lo_text,a)==lo_text) opt_text = 1;
      else return free(filenames),mcpl_tool_usage(argv,"Unrecognised option");
    } else if (n>=1&&a[0]!='-') {
      //input file
      if (!filenames)
        filenames = (char **)mcpl_internal_calloc(argc,sizeof(char*));
      filenames[nfilenames] = a;
      ++nfilenames;
    } else {
      return free(filenames),mcpl_tool_usage(argv,"Bad arguments");
    }
  }

  if ( opt_fakeversion )
    mcpl_internal_fakeconstantversion(1);

  if ( opt_extract==0 && pdgcode_str )
    return free(filenames),mcpl_tool_usage(argv,"-p can only be used with --extract.");

  if ( opt_merge==0 && opt_inplace!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--inplace can only be used with --merge.");

  if ( opt_forcemerge==0 && opt_keepuserflags!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--keepuserflags can only be used with --forcemerge.");

  if ( opt_merge!=0 && opt_forcemerge!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--merge and --forcemerge can not both be specified .");

  int number_dumpopts = (opt_justhead + opt_nohead + (blobkey!=0));
  if (opt_extract==0)
    number_dumpopts += (opt_num_limit!=-1) + (opt_num_skip!=-1);
  int any_dumpopts = number_dumpopts != 0;
  int any_extractopts = (opt_extract!=0||pdgcode_str!=0);
  int any_mergeopts = (opt_merge!=0||opt_forcemerge!=0);
  int any_textopts = (opt_text!=0);
  if (any_dumpopts+any_mergeopts+any_extractopts+any_textopts+opt_repair+opt_version>1)
    return free(filenames),mcpl_tool_usage(argv,"Conflicting options specified.");

  if (blobkey&&(number_dumpopts>1))
    return free(filenames),mcpl_tool_usage(argv,"Do not specify other dump options with -b.");

  if (opt_version) {
    free(filenames);
    if (nfilenames)
      return mcpl_tool_usage(argv,"Unrecognised arguments for --version.");

    if ( mcpl_internal_fakeconstantversion(0) )
      printf("MCPL version " "99.99.99" "\n");
    else
      printf("MCPL version " MCPL_VERSION_STR "\n");
    return 0;
  }

  if (any_mergeopts) {

    if (nfilenames<2)
      return free(filenames),mcpl_tool_usage(argv,
                                             (opt_forcemerge?"Too few arguments for --forcemerge.":"Too few arguments for --merge.") );

    int ifirstinfile = (opt_inplace ? 0 : 1);
    if (!opt_forcemerge) {
      for (i = ifirstinfile+1; i < nfilenames; ++i)
        if (!mcpl_can_merge(filenames[ifirstinfile],filenames[i]))
          return free(filenames),mcpl_tool_usage(argv,"Requested files are incompatible for merge as they have different header info.");
    }

    if (opt_inplace) {
      if ( ! ( !opt_forcemerge && opt_merge) )
        mcpl_error("logic error in argument parsing");
      for (i = ifirstinfile+1; i < nfilenames; ++i)
        mcpl_merge_inplace(filenames[ifirstinfile],filenames[i]);
    } else {
      if (mcpl_file_certainly_exists(filenames[0]))
        return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

      //Disallow .gz endings unless it is .mcpl.gz, in which case we attempt to gzip automatically.
      char * outfn = filenames[0];
      size_t lfn = strlen(outfn);
      int attempt_gzip = 0;
      if( lfn > 8 && !strcmp(outfn + (lfn - 8), ".mcpl.gz")) {
        attempt_gzip = 1;
        outfn = mcpl_internal_malloc(lfn-2);//lfn+1-3
        memcpy(outfn,filenames[0],lfn-3);
        outfn[lfn-3] = '\0';
        if (mcpl_file_certainly_exists(outfn))
          return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists (without .gz extension).");
      } else if( lfn > 3 && !strcmp(outfn + (lfn - 3), ".gz")) {
        return free(filenames),mcpl_tool_usage(argv,"Requested output file should not have .gz extension (unless it is .mcpl.gz).");
      }

      mcpl_outfile_t mf = ( opt_forcemerge ?
                            mcpl_forcemerge_files( outfn, nfilenames-1, (const char**)filenames + 1, opt_keepuserflags) :
                            mcpl_merge_files( outfn, nfilenames-1, (const char**)filenames + 1) );
      if (attempt_gzip) {
        if (!mcpl_closeandgzip_outfile(mf))
          printf("MCPL WARNING: Failed to gzip output. Non-gzipped output is found in %s\n",outfn);
      } else {
        mcpl_close_outfile(mf);
      }
      if (outfn != filenames[0])
        free(outfn);
    }

    free(filenames);
    return 0;
  }

  if (opt_extract) {
    if (nfilenames>2)
      return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

    if (nfilenames!=2)
      return free(filenames),mcpl_tool_usage(argv,"Must specify both input and output files with --extract.");

    if (mcpl_file_certainly_exists(filenames[1]))
      return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

    mcpl_file_t fi = mcpl_open_file(filenames[0]);
    mcpl_outfile_t fo = mcpl_create_outfile(filenames[1]);
    mcpl_transfer_metadata(fi, fo);
    uint64_t fi_nparticles = mcpl_hdr_nparticles(fi);

    if (!opt_preventcomment) {
      char comment[1024];
      snprintf(comment, sizeof(comment), "mcpltool: extracted particles from"
               " file with %" PRIu64 " particles",fi_nparticles);
      mcpl_hdr_add_comment(fo,comment);
    }

    int32_t pdgcode_select = 0;
    if (pdgcode_str) {
      int64_t pdgcode64;
      if (!mcpl_str2int(pdgcode_str, 0, &pdgcode64) || -pdgcode64>2147483648 || pdgcode64>2147483647 || !pdgcode64)
        return free(filenames),mcpl_tool_usage(argv,"Must specify non-zero 32bit integer as argument to -p.");
      pdgcode_select = (int32_t)pdgcode64;
    }

    if (opt_num_skip>0)
      mcpl_seek(fi,(uint64_t)opt_num_skip);

    //uint64_t(-1) instead of UINT64_MAX to fix clang c++98 compilation
    uint64_t left = opt_num_limit>0 ? (uint64_t)opt_num_limit : (uint64_t)-1;
    uint64_t added = 0;

    //Writing the next loop in an annoying way to silence MSVC C4706 warning:
    for (;left;) {
      --left;
      const mcpl_particle_t* particle = mcpl_read(fi);
      if (!particle)
        break;
      if (pdgcode_select && pdgcode_select!= particle->pdgcode)
        continue;
      mcpl_transfer_last_read_particle(fi, fo);//Doing mcpl_add_particle(fo,particle) is potentially (very rarely) lossy
      ++added;
    }

    const char * outfile_fn = mcpl_outfile_filename(fo);
    size_t nn = strlen(outfile_fn);
    char *fo_filename = mcpl_internal_malloc(nn+4);
    //fo_filename[0] = '\0';
    memcpy(fo_filename,outfile_fn,nn+1);
    //memcpy(fo_filename+nn,".gz",4);
    //  strncat(fo_filename,mcpl_outfile_filename(fo),nn);
    if (mcpl_closeandgzip_outfile(fo))
      memcpy(fo_filename+nn,".gz",4);
    //strncat(fo_filename,".gz",3);
    mcpl_close_file(fi);

    printf("MCPL: Successfully extracted %" PRIu64 " / %" PRIu64 " particles from %s into %s\n",
           added,fi_nparticles,filenames[0],fo_filename);
    free(fo_filename);
    free(filenames);
    return 0;
  }

  if (opt_text) {

    if (nfilenames>2)
      return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

    if (nfilenames!=2)
      return free(filenames),mcpl_tool_usage(argv,"Must specify both input and output files with --text.");

    if (mcpl_file_certainly_exists(filenames[1]))
      return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

    mcpl_file_t fi = mcpl_open_file(filenames[0]);
    FILE * fout = mcpl_internal_fopen(filenames[1],"w");
    if (!fout) {
      mcpl_close_file(fi);
      free(filenames);
      return mcpl_tool_usage(argv,"Could not open output file.");
    }

    fprintf(fout,"#MCPL-ASCII\n#ASCII-FORMAT: v1\n#NPARTICLES: %" PRIu64 "\n#END-HEADER\n",mcpl_hdr_nparticles(fi));
    fprintf(fout,"index     pdgcode               ekin[MeV]                   x[cm]          "
            "         y[cm]                   z[cm]                      ux                  "
            "    uy                      uz                time[ms]                  weight  "
            "                 pol-x                   pol-y                   pol-z  userflags\n");
    //Writing the next loop in an annoying way to silence MSVC C4706 warning:
    while (1) {
      const mcpl_particle_t* p = mcpl_read(fi);
      if (!p)
        break;
      uint64_t idx = mcpl_currentposition(fi)-1;//-1 since mcpl_read skipped ahead
      fprintf( fout,"%5" PRIu64
               " %11i %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g"
               " %23.18g %23.18g %23.18g %23.18g %23.18g 0x%08x\n",
               idx,p->pdgcode,p->ekin,p->position[0],p->position[1],p->position[2],
               p->direction[0],p->direction[1],p->direction[2],p->time,p->weight,
               p->polarisation[0],p->polarisation[1],p->polarisation[2],p->userflags);
    }
    fclose(fout);
    mcpl_close_file(fi);
    free(filenames);
    return 0;
  }

  if (nfilenames>1)
    return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

  if (!nfilenames)
    return free(filenames),mcpl_tool_usage(argv,"No input file specified");

  if (opt_repair) {
    mcpl_repair(filenames[0]);
    free(filenames);
    return 0;
  }

  //Dump mode:
  if (blobkey) {
    mcpl_file_t mcplfile = mcpl_open_file(filenames[0]);
    uint32_t ldata;
    const char * data;
    if (!mcpl_hdr_blob(mcplfile, blobkey, &ldata, &data)) {
      mcpl_close_file(mcplfile);
      return 1;
    }
    mcpl_internal_dump_to_stdout( data, ldata );
    free(filenames);
    mcpl_close_file(mcplfile);
    return 0;
  }

  if (opt_justhead&&(opt_num_limit!=-1||opt_num_skip!=-1))
    return free(filenames),mcpl_tool_usage(argv,"Do not specify -l or -s with --justhead");

  if (opt_num_limit<0) opt_num_limit = MCPLIMP_TOOL_DEFAULT_NLIMIT;
  if (opt_num_skip<0) opt_num_skip = MCPLIMP_TOOL_DEFAULT_NSKIP;

  if (opt_justhead&&opt_nohead)
    return free(filenames),mcpl_tool_usage(argv,"Do not supply both --justhead and --nohead.");

  int parts = 0;
  if (opt_nohead) parts=2;
  else if (opt_justhead) parts=1;
  mcpl_dump(filenames[0],parts,opt_num_skip,opt_num_limit);
  free(filenames);
  return 0;
}